

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O2

void __thiscall
CMessageHeader::CMessageHeader
          (CMessageHeader *this,MessageStartChars *pchMessageStartIn,char *pszCommand,
          uint nMessageSizeIn)

{
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined4 *)(this->pchMessageStart)._M_elems = *(undefined4 *)pchMessageStartIn->_M_elems;
  this->pchCommand[0] = '\0';
  this->pchCommand[1] = '\0';
  this->pchCommand[2] = '\0';
  this->pchCommand[3] = '\0';
  this->pchCommand[4] = '\0';
  this->pchCommand[5] = '\0';
  this->pchCommand[6] = '\0';
  this->pchCommand[7] = '\0';
  this->pchCommand[8] = '\0';
  this->pchCommand[9] = '\0';
  this->pchCommand[10] = '\0';
  this->pchCommand[0xb] = '\0';
  this->nMessageSize = 0xffffffff;
  this->pchChecksum[0] = '\0';
  this->pchChecksum[1] = '\0';
  this->pchChecksum[2] = '\0';
  this->pchChecksum[3] = '\0';
  for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 1) {
    if (pszCommand[lVar2] == '\0') goto LAB_00a9fc90;
    this->pchCommand[lVar2] = pszCommand[lVar2];
  }
  if (pszCommand[0xc] != '\0') {
    __assert_fail("pszCommand[i] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/protocol.cpp"
                  ,0x10,
                  "CMessageHeader::CMessageHeader(const MessageStartChars &, const char *, unsigned int)"
                 );
  }
LAB_00a9fc90:
  this->nMessageSize = nMessageSizeIn;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CMessageHeader::CMessageHeader(const MessageStartChars& pchMessageStartIn, const char* pszCommand, unsigned int nMessageSizeIn)
    : pchMessageStart{pchMessageStartIn}
{
    // Copy the command name
    size_t i = 0;
    for (; i < COMMAND_SIZE && pszCommand[i] != 0; ++i) pchCommand[i] = pszCommand[i];
    assert(pszCommand[i] == 0); // Assert that the command name passed in is not longer than COMMAND_SIZE

    nMessageSize = nMessageSizeIn;
}